

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_literals.c
# Opt level: O0

size_t ZSTD_compressLiterals
                 (void *dst,size_t dstCapacity,void *src,size_t srcSize,void *entropyWorkspace,
                 size_t entropyWorkspaceSize,ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,
                 ZSTD_strategy strategy,int disableLiteralCompression,int suspectUncompressible,
                 int bmi2)

{
  void *pvVar1;
  int iVar2;
  void *pvVar3;
  code *pcVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  U32 lhc_2;
  U32 lhc_1;
  U32 lhc;
  size_t minGain;
  huf_compress_f huf_compress;
  int flags;
  HUF_repeat repeat;
  size_t cLitSize;
  symbolEncodingType_e hType;
  U32 singleStream;
  BYTE *ostart;
  size_t lhSize;
  size_t entropyWorkspaceSize_local;
  void *entropyWorkspace_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  ostart = (BYTE *)(long)(int)((0x3ff < srcSize) + 3 + (uint)(0x3fff < srcSize));
  cLitSize._4_4_ = (uint)(srcSize < 0x100);
  cLitSize._0_4_ = 2;
  _hType = dst;
  lhSize = entropyWorkspaceSize;
  entropyWorkspaceSize_local = (size_t)entropyWorkspace;
  entropyWorkspace_local = (void *)srcSize;
  srcSize_local = (size_t)src;
  src_local = (void *)dstCapacity;
  dstCapacity_local = (size_t)dst;
  memcpy(nextHuf,prevHuf,0x810);
  pvVar1 = entropyWorkspace_local;
  if (disableLiteralCompression == 0) {
    pvVar3 = (void *)ZSTD_minLiteralsToCompress(strategy,prevHuf->repeatMode);
    if (pvVar1 < pvVar3) {
      dst_local = (void *)ZSTD_noCompressLiterals
                                    ((void *)dstCapacity_local,(size_t)src_local,
                                     (void *)srcSize_local,(size_t)entropyWorkspace_local);
    }
    else if (src_local < ostart + 1) {
      dst_local = (void *)0xffffffffffffffba;
    }
    else {
      huf_compress._4_4_ = prevHuf->repeatMode;
      uVar6 = 0;
      if (strategy < ZSTD_lazy && entropyWorkspace_local < (void *)0x401) {
        uVar6 = 4;
      }
      uVar7 = 0;
      if (ZSTD_btopt < strategy) {
        uVar7 = 2;
      }
      uVar8 = 0;
      if (suspectUncompressible != 0) {
        uVar8 = 8;
      }
      huf_compress._0_4_ = bmi2 != 0 | uVar6 | uVar7 | uVar8;
      if ((huf_compress._4_4_ == HUF_repeat_valid) && (ostart == (BYTE *)0x3)) {
        cLitSize._4_4_ = 1;
      }
      pcVar4 = HUF_compress4X_repeat;
      if (cLitSize._4_4_ != 0) {
        pcVar4 = HUF_compress1X_repeat;
      }
      _flags = (*pcVar4)((BYTE *)((long)_hType + (long)ostart),(long)src_local - (long)ostart,
                         srcSize_local,entropyWorkspace_local,0xff,0xb,entropyWorkspaceSize_local,
                         lhSize,nextHuf,(long)&huf_compress + 4,(uint)huf_compress);
      if (huf_compress._4_4_ != HUF_repeat_none) {
        cLitSize._0_4_ = 3;
      }
      sVar5 = ZSTD_minGain((size_t)entropyWorkspace_local,strategy);
      if (((_flags == 0) || ((long)entropyWorkspace_local - sVar5 <= _flags)) ||
         (uVar6 = ERR_isError(_flags), uVar6 != 0)) {
        memcpy(nextHuf,prevHuf,0x810);
        dst_local = (void *)ZSTD_noCompressLiterals
                                      ((void *)dstCapacity_local,(size_t)src_local,
                                       (void *)srcSize_local,(size_t)entropyWorkspace_local);
      }
      else if ((_flags == 1) &&
              (((void *)0x7 < entropyWorkspace_local ||
               (iVar2 = allBytesIdentical((void *)srcSize_local,(size_t)entropyWorkspace_local),
               iVar2 != 0)))) {
        memcpy(nextHuf,prevHuf,0x810);
        dst_local = (void *)ZSTD_compressRleLiteralsBlock
                                      ((void *)dstCapacity_local,(size_t)src_local,
                                       (void *)srcSize_local,(size_t)entropyWorkspace_local);
      }
      else {
        if ((int)cLitSize == 2) {
          nextHuf->repeatMode = HUF_repeat_check;
        }
        iVar2 = (int)entropyWorkspace_local;
        iVar9 = (int)_flags;
        if (ostart == (BYTE *)0x3) {
          if ((cLitSize._4_4_ == 0) && (entropyWorkspace_local < (void *)0x6)) {
            __assert_fail("srcSize >= MIN_LITERALS_FOR_4_STREAMS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_literals.c"
                          ,0xd4,
                          "size_t ZSTD_compressLiterals(void *, size_t, const void *, size_t, void *, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_strategy, int, int, int)"
                         );
          }
          MEM_writeLE24(_hType,(int)cLitSize + (uint)((cLitSize._4_4_ != 0 ^ 0xffU) & 1) * 4 +
                               iVar2 * 0x10 + iVar9 * 0x4000);
        }
        else if (ostart == (BYTE *)0x4) {
          if (entropyWorkspace_local < (void *)0x6) {
            __assert_fail("srcSize >= MIN_LITERALS_FOR_4_STREAMS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_literals.c"
                          ,0xda,
                          "size_t ZSTD_compressLiterals(void *, size_t, const void *, size_t, void *, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_strategy, int, int, int)"
                         );
          }
          MEM_writeLE32(_hType,(int)cLitSize + 8 + iVar2 * 0x10 + iVar9 * 0x40000);
        }
        else {
          if (ostart != (BYTE *)0x5) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_literals.c"
                          ,0xe7,
                          "size_t ZSTD_compressLiterals(void *, size_t, const void *, size_t, void *, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_strategy, int, int, int)"
                         );
          }
          if (entropyWorkspace_local < (void *)0x6) {
            __assert_fail("srcSize >= MIN_LITERALS_FOR_4_STREAMS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_literals.c"
                          ,0xe0,
                          "size_t ZSTD_compressLiterals(void *, size_t, const void *, size_t, void *, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_strategy, int, int, int)"
                         );
          }
          MEM_writeLE32(_hType,(int)cLitSize + 0xc + iVar2 * 0x10 + iVar9 * 0x400000);
          *(char *)((long)_hType + 4) = (char)(_flags >> 10);
        }
        dst_local = ostart + _flags;
      }
    }
  }
  else {
    dst_local = (void *)ZSTD_noCompressLiterals
                                  ((void *)dstCapacity_local,(size_t)src_local,(void *)srcSize_local
                                   ,(size_t)entropyWorkspace_local);
  }
  return (size_t)dst_local;
}

Assistant:

size_t ZSTD_compressLiterals (
                  void* dst, size_t dstCapacity,
            const void* src, size_t srcSize,
                  void* entropyWorkspace, size_t entropyWorkspaceSize,
            const ZSTD_hufCTables_t* prevHuf,
                  ZSTD_hufCTables_t* nextHuf,
                  ZSTD_strategy strategy,
                  int disableLiteralCompression,
                  int suspectUncompressible,
                  int bmi2)
{
    size_t const lhSize = 3 + (srcSize >= 1 KB) + (srcSize >= 16 KB);
    BYTE*  const ostart = (BYTE*)dst;
    U32 singleStream = srcSize < 256;
    symbolEncodingType_e hType = set_compressed;
    size_t cLitSize;

    DEBUGLOG(5,"ZSTD_compressLiterals (disableLiteralCompression=%i, srcSize=%u, dstCapacity=%zu)",
                disableLiteralCompression, (U32)srcSize, dstCapacity);

    DEBUGLOG(6, "Completed literals listing (%zu bytes)", showHexa(src, srcSize));

    /* Prepare nextEntropy assuming reusing the existing table */
    ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    if (disableLiteralCompression)
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    /* if too small, don't even attempt compression (speed opt) */
    if (srcSize < ZSTD_minLiteralsToCompress(strategy, prevHuf->repeatMode))
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    RETURN_ERROR_IF(dstCapacity < lhSize+1, dstSize_tooSmall, "not enough space for compression");
    {   HUF_repeat repeat = prevHuf->repeatMode;
        int const flags = 0
            | (bmi2 ? HUF_flags_bmi2 : 0)
            | (strategy < ZSTD_lazy && srcSize <= 1024 ? HUF_flags_preferRepeat : 0)
            | (strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD ? HUF_flags_optimalDepth : 0)
            | (suspectUncompressible ? HUF_flags_suspectUncompressible : 0);

        typedef size_t (*huf_compress_f)(void*, size_t, const void*, size_t, unsigned, unsigned, void*, size_t, HUF_CElt*, HUF_repeat*, int);
        huf_compress_f huf_compress;
        if (repeat == HUF_repeat_valid && lhSize == 3) singleStream = 1;
        huf_compress = singleStream ? HUF_compress1X_repeat : HUF_compress4X_repeat;
        cLitSize = huf_compress(ostart+lhSize, dstCapacity-lhSize,
                                src, srcSize,
                                HUF_SYMBOLVALUE_MAX, LitHufLog,
                                entropyWorkspace, entropyWorkspaceSize,
                                (HUF_CElt*)nextHuf->CTable,
                                &repeat, flags);
        DEBUGLOG(5, "%zu literals compressed into %zu bytes (before header)", srcSize, cLitSize);
        if (repeat != HUF_repeat_none) {
            /* reused the existing table */
            DEBUGLOG(5, "reusing statistics from previous huffman block");
            hType = set_repeat;
        }
    }

    {   size_t const minGain = ZSTD_minGain(srcSize, strategy);
        if ((cLitSize==0) || (cLitSize >= srcSize - minGain) || ERR_isError(cLitSize)) {
            ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
            return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }   }
    if (cLitSize==1) {
        /* A return value of 1 signals that the alphabet consists of a single symbol.
         * However, in some rare circumstances, it could be the compressed size (a single byte).
         * For that outcome to have a chance to happen, it's necessary that `srcSize < 8`.
         * (it's also necessary to not generate statistics).
         * Therefore, in such a case, actively check that all bytes are identical. */
        if ((srcSize >= 8) || allBytesIdentical(src, srcSize)) {
            ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
            return ZSTD_compressRleLiteralsBlock(dst, dstCapacity, src, srcSize);
    }   }

    if (hType == set_compressed) {
        /* using a newly constructed table */
        nextHuf->repeatMode = HUF_repeat_check;
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        if (!singleStream) assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + ((U32)(!singleStream) << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + (2 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + (3 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    DEBUGLOG(5, "Compressed literals: %u -> %u", (U32)srcSize, (U32)(lhSize+cLitSize));
    return lhSize+cLitSize;
}